

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O3

void __thiscall VFS::CVFS::CVFSDir::InternalAppendChild(CVFSDir *this,VFSNode *Child)

{
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> *this_00;
  element_type *peVar1;
  pointer pcVar2;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  pointer psVar7;
  undefined8 uVar8;
  ulong __n;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  CVFSDir *local_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  this_00 = &this->m_Childs;
  psVar7 = (this->m_Childs).
           super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = this;
  if ((this->m_Childs).
      super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == psVar7) {
    uVar11 = 0;
  }
  else {
    lVar9 = 0;
    uVar11 = 0;
    do {
      peVar1 = (Child->super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)&peVar1->m_UpdateLock);
      if (iVar6 != 0) {
        iVar6 = std::__throw_system_error(iVar6);
LAB_0010b879:
        uVar8 = std::__throw_system_error(iVar6);
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        _Unwind_Resume(uVar8);
      }
      pcVar2 = (peVar1->m_Name)._M_dataplus._M_p;
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + (peVar1->m_Name)._M_string_length);
      pthread_mutex_unlock((pthread_mutex_t *)&peVar1->m_UpdateLock);
      lVar10 = *(long *)((long)&(((this_00->
                                  super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + lVar9);
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)(lVar10 + 0x40));
      if (iVar6 != 0) goto LAB_0010b879;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(lVar10 + 8),
                 *(long *)(lVar10 + 0x10) + *(long *)(lVar10 + 8));
      pthread_mutex_unlock((pthread_mutex_t *)(lVar10 + 0x40));
      uVar5 = local_48;
      plVar4 = local_50;
      uVar3 = local_70;
      __n = local_70;
      if (local_48 < local_70) {
        __n = local_48;
      }
      if ((__n == 0) || (iVar6 = memcmp(local_78,local_50,__n), iVar6 == 0)) {
        lVar10 = uVar3 - uVar5;
        if (lVar10 < -0x7fffffff) {
          lVar10 = -0x80000000;
        }
        if (0x7ffffffe < lVar10) {
          lVar10 = 0x7fffffff;
        }
        iVar6 = (int)lVar10;
      }
      if (plVar4 != local_40) {
        operator_delete(plVar4,local_40[0] + 1);
      }
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      psVar7 = (this_00->
               super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar6 < 0) break;
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar11 < (ulong)((long)(local_58->m_Childs).
                                    super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4))
    ;
  }
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  insert(this_00,psVar7 + uVar11,Child);
  return;
}

Assistant:

void InternalAppendChild(VFSNode Child)
                    {
                        size_t Pos = 0;

                        //Sorts the data ascending.
                        for (Pos = 0; Pos < m_Childs.size(); Pos++)
                        {
                            if(Child->Name() < m_Childs[Pos]->Name())
                                break;
                        }
                        
                        m_Childs.insert(m_Childs.begin() + Pos, Child);
                    }